

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O3

void scan_flux_gcr(TrackData *trackdata)

{
  uint uVar1;
  FluxData *flux_revs;
  int bitcell_ns;
  BitBuffer bitbuf;
  FluxDecoder decoder;
  BitBuffer BStack_c8;
  FluxDecoder local_60;
  
  uVar1 = (trackdata->cylhead).cyl;
  bitcell_ns = 0xc80;
  if ((0x10 < (int)uVar1) && (bitcell_ns = 0xdac, 0x17 < uVar1)) {
    bitcell_ns = 4000;
    if (uVar1 < 0x1e) {
      bitcell_ns = 0xea6;
    }
  }
  flux_revs = TrackData::flux(trackdata);
  FluxDecoder::FluxDecoder(&local_60,flux_revs,bitcell_ns,opt.scale,4);
  BitBuffer::BitBuffer(&BStack_c8,_250K,&local_60);
  TrackData::add(trackdata,&BStack_c8);
  scan_bitstream_gcr(trackdata);
  if (BStack_c8.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(BStack_c8.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)BStack_c8.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)BStack_c8.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (BStack_c8.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(BStack_c8.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)BStack_c8.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)BStack_c8.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (BStack_c8.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(BStack_c8.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)BStack_c8.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)BStack_c8.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void scan_flux_gcr(TrackData& trackdata)
{
    int bitcell_ns;

    // C64 GCR disks are zoned, with variable rate depending on cylinder
    if (trackdata.cylhead.cyl < 17)
        bitcell_ns = 3200;
    else if (trackdata.cylhead.cyl < 24)
        bitcell_ns = 3500;
    else if (trackdata.cylhead.cyl < 30)
        bitcell_ns = 3750;
    else
        bitcell_ns = 4000;

    FluxDecoder decoder(trackdata.flux(), bitcell_ns, opt.scale);
    BitBuffer bitbuf(DataRate::_250K, decoder);

    trackdata.add(std::move(bitbuf));
    scan_bitstream_gcr(trackdata);
}